

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

void mcmsplt(mcmcx1def *ctx,mcmon n,ushort siz)

{
  mcmodef *pmVar1;
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  mcmodef *pmVar2;
  mcmon newn;
  mcmon local_2a;
  
  pmVar2 = ctx->mcmcxtab[CONCAT62(in_register_00000032,n) >> 8 & 0xffffff];
  if ((int)CONCAT62(in_register_00000012,siz) + 0x40U <= (uint)pmVar2[(byte)n].mcmosiz) {
    pmVar1 = mcmoal(ctx,&local_2a);
    if (local_2a != 0xffff) {
      pmVar2 = pmVar2 + (byte)n;
      *(mcmon *)(pmVar2->mcmoptr + siz) = local_2a;
      pmVar1->mcmoptr = pmVar2->mcmoptr + (ulong)siz + 8;
      pmVar1->mcmosiz = ((short)*(undefined4 *)&pmVar2->mcmosiz - siz) - 8;
      pmVar1->mcmoflg = 0x80;
      mcmlnkhd(ctx,&ctx->mcmcxfre,local_2a);
      pmVar2->mcmosiz = siz;
    }
  }
  return;
}

Assistant:

static void mcmsplt(mcmcx1def *ctx, mcmon n, ushort siz)
{
    mcmodef *o = mcmgobje(ctx, n);
    mcmon    newn;
    mcmodef *newp;
    
    MCMGLBCTX(ctx);

    if (o->mcmosiz < siz + MCMSPLIT) return;     /* don't split; we're done */

    newp = mcmoal(ctx, &newn);
    if (newn == MCMONINV) return;         /* ignore error - just skip split */

    /* set up the new entry, and link into free list */
    *(mcmon *)(o->mcmoptr + siz) = newn;
    newp->mcmoptr = o->mcmoptr + siz + osrndsz(sizeof(mcmon));
    newp->mcmosiz = o->mcmosiz - siz - osrndsz(sizeof(mcmon));
    newp->mcmoflg = MCMOFFREE;
    mcmlnkhd(ctx, &ctx->mcmcxfre, newn);
    
    o->mcmosiz = siz;       /* size of new object is now exactly as request */
}